

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

bool __thiscall
f8n::runtime::MessageQueue::Contains(MessageQueue *this,IMessageTarget *target,int type)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  IMessageTarget *pIVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  LockT lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->queueMutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  p_Var4 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    bVar5 = p_Var4 == (_List_node_base *)&this->queue;
    if (bVar5) {
LAB_001d1d2e:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return !bVar5;
    }
    plVar1 = (long *)(p_Var4[1]._M_next)->_M_next;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var4[1]._M_next)->_M_prev;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pIVar3 = (IMessageTarget *)(**(code **)(*plVar1 + 0x10))(plVar1);
    if (pIVar3 == target) {
      if (type != -1) {
        iVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
        if (iVar2 != type) goto LAB_001d1d0f;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      goto LAB_001d1d2e;
    }
LAB_001d1d0f:
    p_Var4 = p_Var4->_M_next;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while( true );
}

Assistant:

bool MessageQueue::Contains(IMessageTarget *target, int type) {
    LockT lock(this->queueMutex);

    std::list<EnqueuedMessage*>::iterator it = this->queue.begin();
    while (it != this->queue.end()) {
        IMessagePtr current = (*it)->message;

        if (current->Target() == target) {
            if (type == -1 || type == current->Type()) {
                return true;
            }
        }

        ++it;
    }
    return false;
}